

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_load_save.cpp
# Opt level: O0

void __thiscall Am_Load_Save_Context::Print(Am_Load_Save_Context *this,ostream *out)

{
  ostream *out_local;
  Am_Load_Save_Context *this_local;
  
  if (this->data == (Am_Load_Save_Context_Data *)0x0) {
    std::operator<<(out,"(Am_Load_Save_Context)(nullptr)");
  }
  else {
    (*(this->data->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[2])
              (this->data,out);
  }
  return;
}

Assistant:

void
Am_Load_Save_Context::Register_Prototype(const char *name, Am_Wrapper *value)
{
  if (!data) {
    data = new Am_Load_Save_Context_Data();
  }

  data = static_cast<Am_Load_Save_Context_Data *>(data->Make_Unique());

  Wrapper_Holder holder(value);

  data->names->SetAt(holder, Name_Num(name));
  data->prototypes->SetAt(Name_Num(name), holder);
}